

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int geopolyOverlap(GeoPoly *p1,GeoPoly *p2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  int *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  double y;
  int iMask;
  GeoSegment *pPrev;
  GeoSegment *pSeg;
  GeoSegment *pActive;
  int needSort;
  int rc;
  double rX;
  GeoEvent *pThisEvent;
  sqlite3_int64 nByte;
  GeoOverlap *p;
  sqlite3_int64 nVertex;
  uchar aOverlap [4];
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  uchar side;
  GeoSegment *pGVar6;
  GeoPoly *in_stack_ffffffffffffff68;
  GeoOverlap *in_stack_ffffffffffffff70;
  GeoEvent *in_stack_ffffffffffffff78;
  GeoSegment *pList;
  uint local_6c;
  GeoSegment *local_68;
  GeoSegment *local_60;
  GeoSegment *local_58;
  int local_4c;
  GeoSegment *local_48;
  GeoEvent *local_40;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  side = (uchar)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *in_RDI;
  iVar2 = *in_RSI;
  bVar4 = false;
  local_58 = (GeoSegment *)0x0;
  local_c = 0xaaaaaaaa;
  plVar5 = (long *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (plVar5 == (long *)0x0) {
    local_10 = -1;
  }
  else {
    *plVar5 = (long)(plVar5 + 3);
    plVar5[1] = *plVar5 + (long)(iVar1 + iVar2 + 2) * 0x40;
    *(undefined4 *)((long)plVar5 + 0x14) = 0;
    *(undefined4 *)(plVar5 + 2) = 0;
    geopolyAddSegments(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,side);
    geopolyAddSegments(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,side);
    local_40 = geopolySortEventsByX
                         (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20))
    ;
    bVar3 = false;
    if (local_40 != (GeoEvent *)0x0) {
      bVar3 = local_40->x == 0.0;
    }
    local_48 = (GeoSegment *)0xbff0000000000000;
    if (!bVar3) {
      local_48 = (GeoSegment *)0x0;
    }
    pList = local_48;
    memset(&local_c,0,4);
    for (; local_40 != (GeoEvent *)0x0; local_40 = local_40->pNext) {
      if ((local_40->x != (double)local_48) || (NAN(local_40->x) || NAN((double)local_48))) {
        local_68 = (GeoSegment *)0x0;
        local_6c = 0;
        local_48 = (GeoSegment *)local_40->x;
        if (bVar4) {
          local_58 = geopolySortSegmentsByYAndC(pList);
          bVar4 = false;
        }
        for (local_60 = local_58; local_60 != (GeoSegment *)0x0; local_60 = local_60->pNext) {
          if ((local_68 != (GeoSegment *)0x0) &&
             ((local_68->y != local_60->y || (NAN(local_68->y) || NAN(local_60->y))))) {
            *(undefined1 *)((long)&local_c + (long)(int)local_6c) = 1;
          }
          local_6c = local_60->side ^ local_6c;
          local_68 = local_60;
        }
        local_68 = (GeoSegment *)0x0;
        for (local_60 = local_58; local_60 != (GeoSegment *)0x0; local_60 = local_60->pNext) {
          local_60->y = local_60->C * (double)local_48 + local_60->B;
          if (local_68 != (GeoSegment *)0x0) {
            if ((local_60->y <= local_68->y && local_68->y != local_60->y) &&
               (local_68->side != local_60->side)) {
              local_4c = 1;
              goto LAB_002a1c3d;
            }
            if ((local_68->y != local_60->y) || (NAN(local_68->y) || NAN(local_60->y))) {
              *(undefined1 *)((long)&local_c + (long)(int)local_6c) = 1;
            }
          }
          local_6c = local_60->side ^ local_6c;
          local_68 = local_60;
        }
      }
      if (local_40->eType == 0) {
        pGVar6 = local_40->pSeg;
        pGVar6->y = (double)pGVar6->y0;
        pGVar6->pNext = local_58;
        bVar4 = true;
        local_58 = pGVar6;
      }
      else if (local_58 == local_40->pSeg) {
        if (local_58 == (GeoSegment *)0x0) {
          local_58 = (GeoSegment *)0x0;
        }
        else {
          local_58 = local_58->pNext;
        }
      }
      else {
        for (local_60 = local_58; local_60 != (GeoSegment *)0x0; local_60 = local_60->pNext) {
          if (local_60->pNext == local_40->pSeg) {
            if (local_60->pNext == (GeoSegment *)0x0) {
              pGVar6 = (GeoSegment *)0x0;
            }
            else {
              pGVar6 = local_60->pNext->pNext;
            }
            local_60->pNext = pGVar6;
            break;
          }
        }
      }
    }
    if (local_c._3_1_ == '\0') {
      local_4c = 0;
    }
    else if ((local_c._1_1_ == '\0') || (local_c._2_1_ != '\0')) {
      if ((local_c._1_1_ == '\0') && (local_c._2_1_ != '\0')) {
        local_4c = 2;
      }
      else if ((local_c._1_1_ == '\0') && (local_c._2_1_ == '\0')) {
        local_4c = 4;
      }
      else {
        local_4c = 1;
      }
    }
    else {
      local_4c = 3;
    }
LAB_002a1c3d:
    sqlite3_free((void *)0x2a1c47);
    local_10 = local_4c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int geopolyOverlap(GeoPoly *p1, GeoPoly *p2){
  sqlite3_int64 nVertex = p1->nVertex + p2->nVertex + 2;
  GeoOverlap *p;
  sqlite3_int64 nByte;
  GeoEvent *pThisEvent;
  double rX;
  int rc = 0;
  int needSort = 0;
  GeoSegment *pActive = 0;
  GeoSegment *pSeg;
  unsigned char aOverlap[4];

  nByte = sizeof(GeoEvent)*nVertex*2
           + sizeof(GeoSegment)*nVertex
           + sizeof(GeoOverlap);
  p = sqlite3_malloc64( nByte );
  if( p==0 ) return -1;
  p->aEvent = (GeoEvent*)&p[1];
  p->aSegment = (GeoSegment*)&p->aEvent[nVertex*2];
  p->nEvent = p->nSegment = 0;
  geopolyAddSegments(p, p1, 1);
  geopolyAddSegments(p, p2, 2);
  pThisEvent = geopolySortEventsByX(p->aEvent, p->nEvent);
  rX = pThisEvent && pThisEvent->x==0.0 ? -1.0 : 0.0;
  memset(aOverlap, 0, sizeof(aOverlap));
  while( pThisEvent ){
    if( pThisEvent->x!=rX ){
      GeoSegment *pPrev = 0;
      int iMask = 0;
      GEODEBUG(("Distinct X: %g\n", pThisEvent->x));
      rX = pThisEvent->x;
      if( needSort ){
        GEODEBUG(("SORT\n"));
        pActive = geopolySortSegmentsByYAndC(pActive);
        needSort = 0;
      }
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        if( pPrev ){
          if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
      pPrev = 0;
      for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
        double y = pSeg->C*rX + pSeg->B;
        GEODEBUG(("Segment %d.%d %g->%g\n", pSeg->side, pSeg->idx, pSeg->y, y));
        pSeg->y = y;
        if( pPrev ){
          if( pPrev->y>pSeg->y && pPrev->side!=pSeg->side ){
            rc = 1;
            GEODEBUG(("Crossing: %d.%d and %d.%d\n",
                    pPrev->side, pPrev->idx,
                    pSeg->side, pSeg->idx));
            goto geopolyOverlapDone;
          }else if( pPrev->y!=pSeg->y ){
            GEODEBUG(("MASK: %d\n", iMask));
            aOverlap[iMask] = 1;
          }
        }
        iMask ^= pSeg->side;
        pPrev = pSeg;
      }
    }
    GEODEBUG(("%s %d.%d C=%g B=%g\n",
      pThisEvent->eType ? "RM " : "ADD",
      pThisEvent->pSeg->side, pThisEvent->pSeg->idx,
      pThisEvent->pSeg->C,
      pThisEvent->pSeg->B));
    if( pThisEvent->eType==0 ){
      /* Add a segment */
      pSeg = pThisEvent->pSeg;
      pSeg->y = pSeg->y0;
      pSeg->pNext = pActive;
      pActive = pSeg;
      needSort = 1;
    }else{
      /* Remove a segment */
      if( pActive==pThisEvent->pSeg ){
        pActive = ALWAYS(pActive) ? pActive->pNext : 0;
      }else{
        for(pSeg=pActive; pSeg; pSeg=pSeg->pNext){
          if( pSeg->pNext==pThisEvent->pSeg ){
            pSeg->pNext = ALWAYS(pSeg->pNext) ? pSeg->pNext->pNext : 0;
            break;
          }
        }
      }
    }
    pThisEvent = pThisEvent->pNext;
  }
  if( aOverlap[3]==0 ){
    rc = 0;
  }else if( aOverlap[1]!=0 && aOverlap[2]==0 ){
    rc = 3;
  }else if( aOverlap[1]==0 && aOverlap[2]!=0 ){
    rc = 2;
  }else if( aOverlap[1]==0 && aOverlap[2]==0 ){
    rc = 4;
  }else{
    rc = 1;
  }

geopolyOverlapDone:
  sqlite3_free(p);
  return rc;
}